

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O2

bool __thiscall CaDiCaL::Internal::disconnect_proof_tracer(Internal *this,Tracer *tracer)

{
  Tracer **ppTVar1;
  __normal_iterator<CaDiCaL::Tracer_**,_std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>_>
  __position;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<CaDiCaL::Tracer**,std::vector<CaDiCaL::Tracer*,std::allocator<CaDiCaL::Tracer*>>>,__gnu_cxx::__ops::_Iter_equals_val<CaDiCaL::Tracer*const>>
                         ((this->tracers).
                          super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (this->tracers).
                          super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
  ppTVar1 = (this->tracers).
            super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__position._M_current != ppTVar1) {
    std::vector<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>::erase
              (&this->tracers,(const_iterator)__position._M_current);
    Proof::disconnect(this->proof,tracer);
  }
  return __position._M_current != ppTVar1;
}

Assistant:

bool Internal::disconnect_proof_tracer (Tracer *tracer) {
  auto it = std::find (tracers.begin (), tracers.end (), tracer);
  if (it != tracers.end ()) {
    tracers.erase (it);
    assert (proof);
    proof->disconnect (tracer);
    return true;
  }
  return false;
}